

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_buildDTable_internal
                 (FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  uint *in_RDI;
  long in_R8;
  ulong in_R9;
  U32 nextState;
  BYTE symbol;
  U32 u_1;
  int i_1;
  U32 position_1;
  U32 s_3;
  U32 step_1;
  U32 tableMask_1;
  size_t uPosition;
  size_t u;
  size_t unroll;
  size_t s_2;
  size_t position;
  int n;
  int i;
  U32 s_1;
  U64 sv;
  size_t pos;
  U64 add;
  size_t step;
  size_t tableMask;
  U32 s;
  S16 largeLimit;
  FSE_DTableHeader DTableH;
  U32 highThreshold;
  U32 tableSize;
  U32 maxSV1;
  BYTE *spread;
  U16 *symbolNext;
  FSE_decode_t *tableDecode;
  void *tdPtr;
  uint local_e0;
  int local_dc;
  uint local_d8;
  uint local_d4;
  ulong local_c0;
  ulong local_b0;
  ulong local_a8;
  int local_98;
  uint local_94;
  U64 local_90;
  long local_88;
  uint local_68;
  undefined4 local_60;
  uint local_5c;
  size_t local_8;
  
  lVar5 = in_R8 + (ulong)in_EDX * 2 + 2;
  uVar2 = in_EDX + 1;
  bVar7 = (byte)in_ECX;
  uVar3 = 1 << (bVar7 & 0x1f);
  local_5c = uVar3 - 1;
  if (in_R9 < (ulong)(in_EDX + 1) * 2 + (1L << (bVar7 & 0x3f)) + 8) {
    local_8 = 0xffffffffffffffd2;
  }
  else if (in_EDX < 0x100) {
    if (in_ECX < 0xd) {
      local_60 = CONCAT22(1,(short)in_ECX);
      for (local_68 = 0; local_68 < uVar2; local_68 = local_68 + 1) {
        if (*(short *)(in_RSI + (ulong)local_68 * 2) == -1) {
          *(char *)((long)in_RDI + (ulong)local_5c * 4 + 6) = (char)local_68;
          *(undefined2 *)(in_R8 + (ulong)local_68 * 2) = 1;
          local_5c = local_5c - 1;
        }
        else {
          if ((short)(1 << (bVar7 - 1 & 0x1f)) <= *(short *)(in_RSI + (ulong)local_68 * 2)) {
            local_60 = local_60 & 0xffff;
          }
          *(undefined2 *)(in_R8 + (ulong)local_68 * 2) =
               *(undefined2 *)(in_RSI + (ulong)local_68 * 2);
        }
      }
      *in_RDI = local_60;
      if (local_5c == uVar3 - 1) {
        uVar6 = (ulong)((uVar3 >> 1) + (uVar3 >> 3) + 3);
        local_88 = 0;
        local_90 = 0;
        for (local_94 = 0; local_94 < uVar2; local_94 = local_94 + 1) {
          iVar4 = (int)*(short *)(in_RSI + (ulong)local_94 * 2);
          MEM_write64((void *)(lVar5 + local_88),local_90);
          for (local_98 = 8; local_98 < iVar4; local_98 = local_98 + 8) {
            MEM_write64((void *)(lVar5 + local_88 + (long)local_98),local_90);
          }
          local_88 = iVar4 + local_88;
          local_90 = local_90 + 0x101010101010101;
        }
        local_a8 = 0;
        for (local_b0 = 0; local_b0 < uVar3; local_b0 = local_b0 + 2) {
          for (local_c0 = 0; local_c0 < 2; local_c0 = local_c0 + 1) {
            *(undefined1 *)
             ((long)in_RDI + (local_a8 + local_c0 * uVar6 & (ulong)(uVar3 - 1)) * 4 + 6) =
                 *(undefined1 *)(lVar5 + local_b0 + local_c0);
          }
          local_a8 = local_a8 + uVar6 * 2 & (ulong)(uVar3 - 1);
        }
      }
      else {
        local_d8 = 0;
        for (local_d4 = 0; local_d4 < uVar2; local_d4 = local_d4 + 1) {
          for (local_dc = 0; local_dc < *(short *)(in_RSI + (ulong)local_d4 * 2);
              local_dc = local_dc + 1) {
            *(char *)((long)in_RDI + (ulong)local_d8 * 4 + 6) = (char)local_d4;
            do {
              local_d8 = local_d8 + (uVar3 >> 1) + (uVar3 >> 3) + 3 & uVar3 - 1;
            } while (local_5c < local_d8);
          }
        }
        if (local_d8 != 0) {
          return 0xffffffffffffffff;
        }
      }
      for (local_e0 = 0; local_e0 < uVar3; local_e0 = local_e0 + 1) {
        uVar6 = (ulong)*(byte *)((long)in_RDI + (ulong)local_e0 * 4 + 6);
        sVar1 = *(short *)(in_R8 + uVar6 * 2);
        *(short *)(in_R8 + uVar6 * 2) = sVar1 + 1;
        uVar2 = ZSTD_highbit32(0);
        *(byte *)((long)in_RDI + (ulong)local_e0 * 4 + 7) = bVar7 - (char)uVar2;
        *(short *)(in_RDI + (ulong)local_e0 + 1) =
             (sVar1 << (*(byte *)((long)in_RDI + (ulong)local_e0 * 4 + 7) & 0x1f)) - (short)uVar3;
      }
      local_8 = 0;
    }
    else {
      local_8 = 0xffffffffffffffd4;
    }
  }
  else {
    local_8 = 0xffffffffffffffd2;
  }
  return local_8;
}

Assistant:

static size_t FSE_buildDTable_internal(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16* symbolNext = (U16*)workSpace;
    BYTE* spread = (BYTE*)(symbolNext + maxSymbolValue + 1);

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (FSE_BUILD_DTABLE_WKSP_SIZE(tableLog, maxSymbolValue) > wkspSize) return ERROR(maxSymbolValue_tooLarge);
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        ZSTD_memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        size_t const tableMask = tableSize-1;
        size_t const step = FSE_TABLESTEP(tableSize);
        /* First lay down the symbols in order.
         * We use a uint64_t to lay down 8 bytes at a time. This reduces branch
         * misses since small blocks generally have small table logs, so nearly
         * all symbols have counts <= 8. We ensure we have 8 bytes at the end of
         * our buffer to handle the over-write.
         */
        {
            U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                pos += n;
            }
        }
        /* Now we spread those positions across the table.
         * The benefit of doing it in two stages is that we avoid the
         * variable size inner loop, which caused lots of branch misses.
         * Now we can run through all the positions without any branch misses.
         * We unroll the loop twice, since that is what empirically worked best.
         */
        {
            size_t position = 0;
            size_t s;
            size_t const unroll = 2;
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableDecode[uPosition].symbol = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);
        }
    } else {
        U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - ZSTD_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}